

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

AggregateFunction * duckdb::MinFunction::GetFunction(void)

{
  AggregateFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_79;
  LogicalType local_78;
  LogicalType local_60;
  vector<duckdb::LogicalType,_true> local_48;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"min","");
  LogicalType::LogicalType(&local_60,ANY);
  __l._M_len = 1;
  __l._M_array = &local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48,__l,
             &local_79);
  LogicalType::LogicalType(&local_78,ANY);
  AggregateFunction::AggregateFunction
            (in_RDI,&local_30,&local_48,&local_78,(aggregate_size_t)0x0,(aggregate_initialize_t)0x0,
             (aggregate_update_t)0x0,(aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,
             (aggregate_simple_update_t)0x0,
             BindMinMax<duckdb::MinOperation,duckdb::MinOperationString,duckdb::MinOperationVector>,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_78);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  LogicalType::~LogicalType(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

AggregateFunction MinFunction::GetFunction() {
	return GetMinMaxOperator<MinOperation, MinOperationString, MinOperationVector>("min");
}